

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O3

void Saig_BmcLoadCnf(Saig_Bmc_t *p,Cnf_Dat_t *pCnf)

{
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int Fill;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  long lVar7;
  long lVar8;
  int Lits [2];
  uint local_40;
  int local_3c;
  Cnf_Dat_t *local_38;
  
  pVVar6 = p->vVisited;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    local_38 = pCnf;
    do {
      iVar5 = pVVar6->pArray[lVar8];
      if (((long)iVar5 < 0) || (pVVar1 = p->pFrm->vObjs, pVVar1->nSize <= iVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = pVVar1->pArray[iVar5];
      lVar7 = *(long *)((long)pvVar2 + 0x28);
      *(undefined8 *)((long)pvVar2 + 0x28) = 0;
      iVar5 = pCnf->pVarNums[*(int *)(lVar7 + 0x24)];
      if (iVar5 != -1) {
        pVVar6 = p->vObj2Var;
        iVar4 = *(int *)((long)pvVar2 + 0x24);
        Vec_IntFillExtra(pVVar6,iVar4 + 1,(int)in_RDX);
        if (((long)iVar4 < 0) || (pVVar6->nSize <= iVar4)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (pVVar6->pArray[iVar4] == 0) {
          pVVar6 = p->vObj2Var;
          iVar4 = *(int *)((long)pvVar2 + 0x24);
          Vec_IntFillExtra(pVVar6,iVar4 + 1,Fill);
          if (((long)iVar4 < 0) || (pVVar6->nSize <= iVar4)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          pVVar6->pArray[iVar4] = iVar5;
          in_RDX = extraout_RDX_00;
          pCnf = local_38;
        }
        else {
          uVar3 = pVVar6->pArray[iVar4] * 2;
          local_3c = iVar5 * 2 + 1;
          local_40 = uVar3;
          iVar4 = sat_solver_addclause(p->pSat,(lit *)&local_40,(lit *)&local_38);
          if (iVar4 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcBmc2.c"
                          ,0x243,"void Saig_BmcLoadCnf(Saig_Bmc_t *, Cnf_Dat_t *)");
          }
          local_3c = iVar5 * 2;
          local_40 = uVar3 | 1;
          iVar5 = sat_solver_addclause(p->pSat,(lit *)&local_40,(lit *)&local_38);
          in_RDX = extraout_RDX;
          pCnf = local_38;
          if (iVar5 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcBmc2.c"
                          ,0x247,"void Saig_BmcLoadCnf(Saig_Bmc_t *, Cnf_Dat_t *)");
          }
        }
      }
      lVar8 = lVar8 + 1;
      pVVar6 = p->vVisited;
    } while (lVar8 < pVVar6->nSize);
  }
  lVar8 = 0;
  do {
    lVar7 = lVar8;
    iVar5 = pCnf->nClauses;
    if (iVar5 <= lVar7) goto LAB_004f0449;
    iVar5 = sat_solver_addclause(p->pSat,pCnf->pClauses[lVar7],pCnf->pClauses[lVar7 + 1]);
    lVar8 = lVar7 + 1;
  } while (iVar5 != 0);
  iVar5 = pCnf->nClauses;
LAB_004f0449:
  if ((int)lVar7 < iVar5) {
    puts("SAT solver became UNSAT after adding clauses.");
  }
  return;
}

Assistant:

void Saig_BmcLoadCnf( Saig_Bmc_t * p, Cnf_Dat_t * pCnf )
{
    Aig_Obj_t * pObj, * pObjNew;
    int i, Lits[2], VarNumOld, VarNumNew;
    Aig_ManForEachObjVec( p->vVisited, p->pFrm, pObj, i )
    {
        // get the new variable of this node
        pObjNew     = (Aig_Obj_t *)pObj->pData;
        pObj->pData = NULL;
        VarNumNew   = pCnf->pVarNums[ pObjNew->Id ];
        if ( VarNumNew == -1 )
            continue;
        // get the old variable of this node
        VarNumOld   = Saig_BmcSatNum( p, pObj );
        if ( VarNumOld == 0 )
        {
            Saig_BmcSetSatNum( p, pObj, VarNumNew );
            continue;
        }
        // add clauses connecting existing variables
        Lits[0] = toLitCond( VarNumOld, 0 );
        Lits[1] = toLitCond( VarNumNew, 1 );
        if ( !sat_solver_addclause( p->pSat, Lits, Lits+2 ) )
            assert( 0 );
        Lits[0] = toLitCond( VarNumOld, 1 );
        Lits[1] = toLitCond( VarNumNew, 0 );
        if ( !sat_solver_addclause( p->pSat, Lits, Lits+2 ) )
            assert( 0 );
    }
    // add CNF to the SAT solver
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( p->pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            break;
    if ( i < pCnf->nClauses )
        printf( "SAT solver became UNSAT after adding clauses.\n" );
}